

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O2

FT_Error ft_var_load_hvvar(TT_Face face,FT_Bool vertical)

{
  FT_Stream pFVar1;
  FT_Memory memory;
  GX_Blend pGVar2;
  byte bVar3;
  FT_UShort FVar4;
  FT_UShort FVar5;
  uint uVar6;
  FT_Error FVar7;
  FT_ULong FVar8;
  GX_HVVarTable itemStore;
  FT_UInt *pFVar9;
  undefined7 in_register_00000031;
  FT_ULong FVar10;
  int iVar11;
  uint uVar12;
  bool bVar13;
  FT_ULong local_68;
  FT_ULong table_len;
  GX_Blend local_58;
  int local_4c;
  uint local_48;
  uint local_44;
  FT_Memory local_40;
  int local_38;
  FT_Error local_34;
  
  iVar11 = (int)CONCAT71(in_register_00000031,vertical);
  pFVar1 = (face->root).stream;
  memory = pFVar1->memory;
  pGVar2 = face->blend;
  FVar10 = 0x56564152;
  if (iVar11 == 0) {
    FVar10 = 0x48564152;
  }
  (&pGVar2->hvar_loaded)[(ulong)(iVar11 != 0) * 0x10] = '\x01';
  local_34 = (*face->goto_table)(face,FVar10,pFVar1,&local_68);
  if (local_34 != 0) {
    return local_34;
  }
  local_58 = pGVar2;
  local_4c = iVar11;
  local_40 = (FT_Memory)FT_Stream_Pos(pFVar1);
  FVar4 = FT_Stream_ReadUShort(pFVar1,&local_34);
  if (local_34 != 0) {
    return local_34;
  }
  local_34 = FT_Stream_Skip(pFVar1,2);
  if (local_34 != 0) {
    return local_34;
  }
  if (FVar4 == 1) {
    FVar10 = FT_Stream_ReadULong(pFVar1,&local_34);
    if (local_34 != 0) {
      return local_34;
    }
    FVar8 = FT_Stream_ReadULong(pFVar1,&local_34);
    if (local_34 != 0) {
      return local_34;
    }
    itemStore = (GX_HVVarTable)ft_mem_alloc(memory,0x38,&local_34);
    if ((char)local_4c == '\0') {
      local_58->hvar_table = itemStore;
    }
    else {
      local_58->vvar_table = itemStore;
    }
    if (local_34 != 0) {
      return local_34;
    }
    local_34 = ft_var_load_item_variation_store
                         (face,FVar10 + (long)local_40,(GX_ItemVarStore)itemStore);
    if (local_34 != 0) {
      return local_34;
    }
    if (FVar8 != 0) {
      FVar8 = FVar8 + (long)local_40;
      pFVar1 = (face->root).stream;
      local_40 = pFVar1->memory;
      local_38 = FT_Stream_Seek(pFVar1,FVar8);
      if (local_38 != 0) {
        return local_38;
      }
      FVar4 = FT_Stream_ReadUShort(pFVar1,&local_38);
      if (local_38 != 0) {
        return local_38;
      }
      FVar5 = FT_Stream_ReadUShort(pFVar1,&local_38);
      (itemStore->widthMap).mapCount = (uint)FVar5;
      if (local_38 != 0) {
        return local_38;
      }
      if (0x3f < FVar4) goto LAB_00224b70;
      local_48 = FVar4 & 0xf;
      local_44 = 2 << (sbyte)local_48;
      pFVar9 = (FT_UInt *)ft_mem_realloc(local_40,4,0,(ulong)FVar5,(void *)0x0,&local_38);
      (itemStore->widthMap).innerIndex = pFVar9;
      if (local_38 != 0) {
        return local_38;
      }
      pFVar9 = (FT_UInt *)
               ft_mem_realloc(local_40,4,0,(ulong)(itemStore->widthMap).mapCount,(void *)0x0,
                              &local_38);
      (itemStore->widthMap).outerIndex = pFVar9;
      if (local_38 != 0) {
        return local_38;
      }
      local_48 = local_48 + 1;
      local_44 = local_44 - 1;
      table_len._4_4_ = (FVar4 >> 4) + 1;
      for (local_40 = (FT_Memory)0x0; local_40 < (ulong)(itemStore->widthMap).mapCount;
          local_40 = (FT_Memory)((long)local_40 + 1)) {
        uVar12 = 0;
        iVar11 = table_len._4_4_;
        while (bVar13 = iVar11 != 0, iVar11 = iVar11 + -1, bVar13) {
          bVar3 = FT_Stream_ReadChar(pFVar1,&local_38);
          if (local_38 != 0) {
            return local_38;
          }
          uVar12 = uVar12 << 8 | (uint)bVar3;
        }
        uVar6 = uVar12 >> ((byte)local_48 & 0x1f);
        if ((itemStore->itemStore).dataCount <= uVar6) goto LAB_00224b70;
        (itemStore->widthMap).outerIndex[(long)local_40] = uVar6;
        if ((itemStore->itemStore).varData[uVar6].itemCount <= (uVar12 & local_44))
        goto LAB_00224b70;
        (itemStore->widthMap).innerIndex[(long)local_40] = uVar12 & local_44;
      }
      if (local_38 != 0) {
        return local_38;
      }
    }
    if ((char)local_4c == '\0') {
      local_58->hvar_checked = '\x01';
      *(byte *)&face->variation_support = (byte)face->variation_support | 2;
    }
    else {
      local_58->vvar_checked = '\x01';
      *(byte *)&face->variation_support = (byte)face->variation_support | 0x10;
    }
    FVar7 = 0;
  }
  else {
LAB_00224b70:
    FVar7 = 8;
  }
  return FVar7;
}

Assistant:

static FT_Error
  ft_var_load_hvvar( TT_Face  face,
                     FT_Bool  vertical )
  {
    FT_Stream  stream = FT_FACE_STREAM( face );
    FT_Memory  memory = stream->memory;

    GX_Blend  blend = face->blend;

    GX_HVVarTable  table;

    FT_Error   error;
    FT_UShort  majorVersion;
    FT_ULong   table_len;
    FT_ULong   table_offset;
    FT_ULong   store_offset;
    FT_ULong   widthMap_offset;


    if ( vertical )
    {
      blend->vvar_loaded = TRUE;

      FT_TRACE2(( "VVAR " ));

      error = face->goto_table( face, TTAG_VVAR, stream, &table_len );
    }
    else
    {
      blend->hvar_loaded = TRUE;

      FT_TRACE2(( "HVAR " ));

      error = face->goto_table( face, TTAG_HVAR, stream, &table_len );
    }

    if ( error )
    {
      FT_TRACE2(( "is missing\n" ));
      goto Exit;
    }

    table_offset = FT_STREAM_POS();

    /* skip minor version */
    if ( FT_READ_USHORT( majorVersion ) ||
         FT_STREAM_SKIP( 2 )            )
      goto Exit;

    if ( majorVersion != 1 )
    {
      FT_TRACE2(( "bad table version %d\n", majorVersion ));
      error = FT_THROW( Invalid_Table );
      goto Exit;
    }

    if ( FT_READ_ULONG( store_offset )    ||
         FT_READ_ULONG( widthMap_offset ) )
      goto Exit;

    if ( vertical )
    {
      if ( FT_NEW( blend->vvar_table ) )
        goto Exit;
      table = blend->vvar_table;
    }
    else
    {
      if ( FT_NEW( blend->hvar_table ) )
        goto Exit;
      table = blend->hvar_table;
    }

    error = ft_var_load_item_variation_store(
              face,
              table_offset + store_offset,
              &table->itemStore );
    if ( error )
      goto Exit;

    if ( widthMap_offset )
    {
      error = ft_var_load_delta_set_index_mapping(
                face,
                table_offset + widthMap_offset,
                &table->widthMap,
                &table->itemStore );
      if ( error )
        goto Exit;
    }

    FT_TRACE2(( "loaded\n" ));
    error = FT_Err_Ok;

  Exit:
    if ( !error )
    {
      if ( vertical )
      {
        blend->vvar_checked = TRUE;

        /* FreeType doesn't provide functions to quickly retrieve    */
        /* TSB, BSB, or VORG values; we thus don't have to implement */
        /* support for those three item variation stores.            */

        face->variation_support |= TT_FACE_FLAG_VAR_VADVANCE;
      }
      else
      {
        blend->hvar_checked = TRUE;

        /* FreeType doesn't provide functions to quickly retrieve */
        /* LSB or RSB values; we thus don't have to implement     */
        /* support for those two item variation stores.           */

        face->variation_support |= TT_FACE_FLAG_VAR_HADVANCE;
      }
    }

    return error;
  }